

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall
llvm::yaml::Output::preflightKey
          (Output *this,char *Key,bool Required,bool SameAsDefault,bool *UseDefault,void **param_5)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  StringRef Key_00;
  StringRef key;
  
  *UseDefault = false;
  if ((!SameAsDefault || Required) || (this->WriteDefaultValues == true)) {
    uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                   super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                   super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                   super_SmallVectorBase.Size;
    if (uVar2 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0xa7,
                    "reference llvm::SmallVectorTemplateCommon<llvm::yaml::Output::InState>::back() [T = llvm::yaml::Output::InState]"
                   );
    }
    if ((*(uint *)((long)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                         super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                         super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                         super_SmallVectorBase.BeginX + uVar2 * 4 + -4) & 0xfffffffe) == 6) {
      if (Key == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(Key);
      }
      Key_00.Length = sVar3;
      Key_00.Data = Key;
      flowKey(this,Key_00);
    }
    else {
      newLineCheck(this);
      if (Key == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(Key);
      }
      key.Length = sVar3;
      key.Data = Key;
      paddedKey(this,key);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Output::preflightKey(const char *Key, bool Required, bool SameAsDefault,
                          bool &UseDefault, void *&) {
  UseDefault = false;
  if (Required || !SameAsDefault || WriteDefaultValues) {
    auto State = StateStack.back();
    if (State == inFlowMapFirstKey || State == inFlowMapOtherKey) {
      flowKey(Key);
    } else {
      newLineCheck();
      paddedKey(Key);
    }
    return true;
  }
  return false;
}